

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringsTest.cc
# Opt level: O3

void print_data_test_case<std::__cxx11::string>
               (string *expected_output,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  size_t sVar3;
  int iVar4;
  _Alloc_hider _Var5;
  string output_data;
  string local_78;
  string local_58;
  code *local_38;
  FILE *local_30;
  
  paVar1 = &local_78.field_2;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"StringsTest-data","");
  paVar2 = &local_58.field_2;
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"w","");
  phosg::fopen_unique((phosg *)&local_38,&local_78,&local_58,(FILE *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  phosg::print_data(local_30,args,0,(void *)0x0,2);
  if (local_30 != (FILE *)0x0) {
    (*local_38)();
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"StringsTest-data","");
  phosg::load_file(&local_78,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  sVar3 = expected_output->_M_string_length;
  if (sVar3 == local_78._M_string_length) {
    if (sVar3 != 0) {
      iVar4 = bcmp((expected_output->_M_dataplus)._M_p,local_78._M_dataplus._M_p,sVar3);
      if (iVar4 != 0) goto LAB_00111f36;
    }
  }
  else {
LAB_00111f36:
    fputs("(print_data) Expected:\n",_stderr);
    fwrite((expected_output->_M_dataplus)._M_p,1,expected_output->_M_string_length,_stderr);
    fputs("(print_data) Actual:\n",_stderr);
    fwrite(local_78._M_dataplus._M_p,1,local_78._M_string_length,_stderr);
    phosg::expect_generic
              (false,"!(false)",
               "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
               ,0x1d);
  }
  phosg::format_data((string *)&local_58,args,0,(void *)0x0,2);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_78,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  _Var5._M_p = local_78._M_dataplus._M_p;
  sVar3 = expected_output->_M_string_length;
  if (sVar3 == local_78._M_string_length) {
    if (sVar3 == 0) goto LAB_00112002;
    iVar4 = bcmp((expected_output->_M_dataplus)._M_p,local_78._M_dataplus._M_p,sVar3);
    if (iVar4 == 0) goto LAB_00112002;
  }
  fputs("(format_data) Expected:\n",_stderr);
  fwrite((expected_output->_M_dataplus)._M_p,1,expected_output->_M_string_length,_stderr);
  fputs("(format_data) Actual:\n",_stderr);
  fwrite(local_78._M_dataplus._M_p,1,local_78._M_string_length,_stderr);
  phosg::expect_generic
            (false,"!(false)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/StringsTest.cc"
             ,0x27);
  _Var5._M_p = local_78._M_dataplus._M_p;
LAB_00112002:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var5._M_p != paVar1) {
    operator_delete(_Var5._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void print_data_test_case(const string& expected_output, ArgTs... args) {

  // macOS doesn't have fmemopen, so we just write to a file because I'm too
  // lazy to use funopen()
  {
    auto f = fopen_unique("StringsTest-data", "w");
    print_data(f.get(), args...);
  }
  string output_data = load_file("StringsTest-data");

  if (expected_output != output_data) {
    fputs("(print_data) Expected:\n", stderr);
    fwrite(expected_output.data(), 1, expected_output.size(), stderr);
    fputs("(print_data) Actual:\n", stderr);
    fwrite(output_data.data(), 1, output_data.size(), stderr);
    expect(false);
  }

  // Also test format_data - it should produce the same result
  output_data = format_data(args...);
  if (expected_output != output_data) {
    fputs("(format_data) Expected:\n", stderr);
    fwrite(expected_output.data(), 1, expected_output.size(), stderr);
    fputs("(format_data) Actual:\n", stderr);
    fwrite(output_data.data(), 1, output_data.size(), stderr);
    expect(false);
  }
}